

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O1

void CMCondition_destroy(CMControlList cl,int condition)

{
  CMCondition ptr;
  CMCondition p_Var1;
  
  ptr = cl->condition_list;
  if (ptr == (CMCondition)0x0) {
LAB_00121d3c:
    ptr = (CMCondition)0x0;
  }
  else {
    if (ptr->condition_num == condition) {
      p_Var1 = (CMCondition)&cl->condition_list;
    }
    else {
      do {
        p_Var1 = ptr;
        ptr = p_Var1->next;
        if (ptr == (CMCondition)0x0) goto LAB_00121d3c;
      } while (ptr->condition_num != condition);
    }
    p_Var1->next = ptr->next;
  }
  if (ptr != (CMCondition)0x0) {
    pthread_cond_destroy((pthread_cond_t *)&ptr->cond_condition);
    INT_CMfree(ptr);
    return;
  }
  fprintf(_stderr,"Serious internal error.  Use of condition %d, no longer in control list\n");
  return;
}

Assistant:

void
CMCondition_destroy(CMControlList cl, int condition)
{
    CMCondition cond = NULL, prev = NULL;
    CMCondition next = NULL;

    if (cl->condition_list) {
	if (cl->condition_list->condition_num == condition) {
	    cond = cl->condition_list;
	    cl->condition_list = cl->condition_list->next;
	} else {
	    prev = cl->condition_list;
	    next = cl->condition_list->next;
	    while (next != NULL) {
		if (next->condition_num == condition) {
		    cond = next;
		    prev->next = next->next;
		    break;
		}
		prev = next;
		next = next->next;
	    }
	}
    }
    if (cond == NULL) {
	fprintf(stderr, "Serious internal error.  Use of condition %d, no longer in control list\n", condition);
    } else {
	/* free internal elements */
	thr_condition_free(cond->cond_condition);
	INT_CMfree(cond);
    }
}